

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

int32_t __thiscall
fasttext::Dictionary::getLine
          (Dictionary *this,istream *in,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *words,minstd_rand *rng)

{
  int32_t id;
  bool bVar1;
  entry_type eVar2;
  __type _Var3;
  uint uVar4;
  uint uVar5;
  Dictionary *this_00;
  result_type_conflict1 rVar6;
  string token;
  param_type local_68;
  undefined1 local_50 [32];
  
  local_68 = (param_type)vmovhps_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  local_50._0_8_ = local_50 + 0x10;
  local_50._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_50[0x10] = 0;
  reset(this,in);
  this_00 = (Dictionary *)words;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(words);
  uVar5 = 0;
  while (bVar1 = readWord(this_00,in,(string *)local_50), uVar4 = uVar5, bVar1) {
    this_00 = this;
    uVar4 = find(this,(string *)local_50);
    id = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[uVar4];
    if (-1 < id) {
      eVar2 = getType(this,id);
      if (eVar2 == word) {
        rVar6 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)&local_68,rng);
        bVar1 = discard(this,id,(float)rVar6);
        if (!bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(words,(value_type *)local_50);
        }
      }
      uVar4 = uVar5 + 1;
      if ((0x3ff < uVar5) ||
         (this_00 = (Dictionary *)local_50,
         _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_50,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)EOS_abi_cxx11_), uVar5 = uVar4, _Var3)) break;
    }
  }
  std::__cxx11::string::~string((string *)local_50);
  return uVar4;
}

Assistant:

int32_t Dictionary::getLine(std::istream& in,
                                std::vector<std::string>& words,
                                std::minstd_rand& rng) const {
      std::uniform_real_distribution<> uniform(0, 1);
      std::string token;
      int32_t ntokens = 0;

      reset(in);
      words.clear();
      while (readWord(in, token)) {
        int32_t h = find(token);
        int32_t wid = word2int_[h];
        if (wid < 0) continue;

        ntokens++;
        if (getType(wid) == entry_type::word && !discard(wid, uniform(rng))) {
          words.push_back(token);
        }
        if (ntokens > MAX_LINE_SIZE || token == EOS) break;
      }
      return ntokens;
    }